

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

CURLcode Curl_doh_is_resolved(connectdata *conn,Curl_dns_entry **dnsp)

{
  ushort uVar1;
  int iVar2;
  Curl_easy *data;
  Curl_easy *data_00;
  uint uVar3;
  undefined8 uVar4;
  DOHcode DVar5;
  DOHcode DVar6;
  size_t sVar7;
  Curl_addrinfo *pCVar8;
  sockaddr *psVar9;
  Curl_dns_entry *pCVar10;
  sa_family_t sVar11;
  char *pcVar12;
  undefined8 *puVar13;
  ulong uVar14;
  uchar *puVar15;
  Curl_addrinfo *pCVar16;
  char *pcVar17;
  Curl_addrinfo *addr;
  curl_socklen_t cVar18;
  size_t maxlength;
  ulong uVar19;
  long lVar20;
  char local_308 [10];
  char local_2fe [126];
  dohentry de;
  
  data = conn->data;
  *dnsp = (Curl_dns_entry *)0x0;
  data_00 = (data->req).doh.probe[0].easy;
  if ((data_00 == (Curl_easy *)0x0) && ((data->req).doh.probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DOH-resolve: %s",(conn->async).hostname);
    return (((conn->bits).field_0x4 & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  if ((data->req).doh.pending != 0) {
    return CURLE_OK;
  }
  curl_multi_remove_handle(data->multi,data_00);
  Curl_close((data->req).doh.probe[0].easy);
  curl_multi_remove_handle(data->multi,(data->req).doh.probe[1].easy);
  Curl_close((data->req).doh.probe[1].easy);
  memset(&de,0,0x250);
  de.ttl = 0x7fffffff;
  DVar5 = doh_decode((data->req).doh.probe[0].serverdoh.memory,
                     (data->req).doh.probe[0].serverdoh.size,(data->req).doh.probe[0].dnstype,&de);
  (*Curl_cfree)((data->req).doh.probe[0].serverdoh.memory);
  if (DVar5 != DOH_OK) {
    if (DVar5 < (DOH_DNS_BAD_ID|DOH_DNS_BAD_LABEL)) {
      pcVar17 = errors[DVar5];
    }
    else {
      pcVar17 = "bad error code";
    }
    pcVar12 = "AAAA";
    if ((data->req).doh.probe[0].dnstype == 1) {
      pcVar12 = "A";
    }
    Curl_infof(data,"DOH: %s type %s for %s\n",pcVar17,pcVar12,(data->req).doh.host);
  }
  DVar6 = doh_decode((data->req).doh.probe[1].serverdoh.memory,
                     (data->req).doh.probe[1].serverdoh.size,(data->req).doh.probe[1].dnstype,&de);
  (*Curl_cfree)((data->req).doh.probe[1].serverdoh.memory);
  if (DVar6 != DOH_OK) {
    if (DVar6 < (DOH_DNS_BAD_ID|DOH_DNS_BAD_LABEL)) {
      pcVar17 = errors[DVar6];
    }
    else {
      pcVar17 = "bad error code";
    }
    pcVar12 = "AAAA";
    if ((data->req).doh.probe[1].dnstype == 1) {
      pcVar12 = "A";
    }
    Curl_infof(data,"DOH: %s type %s for %s\n",pcVar17,pcVar12,(data->req).doh.host);
    if (DVar5 != DOH_OK) goto LAB_003cdd2b;
  }
  Curl_infof(data,"DOH Host name: %s\n",(data->req).doh.host);
  Curl_infof(data,"TTL: %u seconds\n",(ulong)de.ttl);
  uVar3 = de.numaddr;
  if (de.numaddr < 1) {
    uVar3 = 0;
  }
  puVar15 = de.addr[0].ip.v4 + 1;
  for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
    iVar2 = de.addr[uVar14].type;
    if (iVar2 == 0x1c) {
      curl_msnprintf(local_308,0x80,"DOH AAAA: ");
      pcVar17 = local_2fe;
      maxlength = 0x76;
      for (uVar19 = 0; uVar19 < 0x10; uVar19 = uVar19 + 2) {
        pcVar12 = "    :";
        if (uVar19 == 0) {
          pcVar12 = "PK\x01\x02";
        }
        curl_msnprintf(pcVar17,maxlength,"%s%02x%02x",pcVar12 + 4,(ulong)puVar15[uVar19 - 1],
                       (ulong)puVar15[uVar19]);
        sVar7 = strlen(pcVar17);
        maxlength = maxlength - sVar7;
        pcVar17 = pcVar17 + sVar7;
      }
      Curl_infof(data,"%s\n",local_308);
    }
    else if (iVar2 == 1) {
      Curl_infof(data,"DOH A: %u.%u.%u.%u\n",(ulong)de.addr[uVar14].ip.v4[0],
                 (ulong)de.addr[uVar14].ip.v4[1],(ulong)de.addr[uVar14].ip.v4[2],
                 (ulong)de.addr[uVar14].ip.v4[3]);
    }
    puVar15 = puVar15 + 0x14;
  }
  uVar14 = (ulong)(uint)de.numcname;
  if (de.numcname < 1) {
    uVar14 = 0;
  }
  for (lVar20 = 0; uVar14 * 0x18 - lVar20 != 0; lVar20 = lVar20 + 0x18) {
    Curl_infof(data,"CNAME: %s\n",*(undefined8 *)((long)&de.cname[0].alloc + lVar20));
  }
  pcVar17 = (data->req).doh.host;
  uVar1 = (ushort)(data->req).doh.port;
  addr = (Curl_addrinfo *)0x0;
  pCVar16 = (Curl_addrinfo *)0x0;
  for (lVar20 = 0; (ulong)uVar3 * 0x14 != lVar20; lVar20 = lVar20 + 0x14) {
    iVar2 = *(int *)((long)&de.addr[0].type + lVar20);
    cVar18 = 0x1c;
    if (iVar2 != 0x1c) {
      cVar18 = 0x10;
    }
    pCVar8 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
    if (pCVar8 == (Curl_addrinfo *)0x0) {
LAB_003ce08e:
      Curl_freeaddrinfo(addr);
      goto LAB_003ce096;
    }
    pcVar12 = (*Curl_cstrdup)(pcVar17);
    pCVar8->ai_canonname = pcVar12;
    if (pcVar12 == (char *)0x0) {
LAB_003ce082:
      (*Curl_cfree)(pCVar8);
      goto LAB_003ce08e;
    }
    psVar9 = (sockaddr *)(*Curl_ccalloc)(1,(size_t)cVar18);
    pCVar8->ai_addr = psVar9;
    if (psVar9 == (sockaddr *)0x0) {
      (*Curl_cfree)(pCVar8->ai_canonname);
      goto LAB_003ce082;
    }
    if (addr == (Curl_addrinfo *)0x0) {
      addr = pCVar8;
    }
    if (pCVar16 != (Curl_addrinfo *)0x0) {
      pCVar16->ai_next = pCVar8;
    }
    puVar13 = (undefined8 *)((long)&de.addr[0].ip + lVar20);
    pCVar8->ai_family = (uint)(iVar2 == 0x1c) * 8 + 2;
    pCVar8->ai_socktype = 1;
    pCVar8->ai_addrlen = cVar18;
    if (iVar2 == 0x1c) {
      uVar4 = *(undefined8 *)((long)&de.addr[0].ip + lVar20 + 8);
      *(undefined8 *)(psVar9->sa_data + 6) = *puVar13;
      psVar9[1].sa_family = (short)uVar4;
      psVar9[1].sa_data[0] = (char)((ulong)uVar4 >> 0x10);
      psVar9[1].sa_data[1] = (char)((ulong)uVar4 >> 0x18);
      psVar9[1].sa_data[2] = (char)((ulong)uVar4 >> 0x20);
      psVar9[1].sa_data[3] = (char)((ulong)uVar4 >> 0x28);
      psVar9[1].sa_data[4] = (char)((ulong)uVar4 >> 0x30);
      psVar9[1].sa_data[5] = (char)((ulong)uVar4 >> 0x38);
      sVar11 = 10;
    }
    else {
      *(undefined4 *)(psVar9->sa_data + 2) = *(undefined4 *)puVar13;
      sVar11 = 2;
    }
    psVar9->sa_family = sVar11;
    *(ushort *)psVar9->sa_data = uVar1 << 8 | uVar1 >> 8;
    pCVar16 = pCVar8;
  }
  if (addr == (Curl_addrinfo *)0x0) {
LAB_003ce096:
    de_cleanup(&de);
    return CURLE_OUT_OF_MEMORY;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  pCVar10 = Curl_cache_addr(data,addr,(data->req).doh.host,(data->req).doh.port);
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  de_cleanup(&de);
  if (pCVar10 != (Curl_dns_entry *)0x0) {
    (conn->async).dns = pCVar10;
    *dnsp = pCVar10;
    return CURLE_OK;
  }
  Curl_freeaddrinfo(addr);
LAB_003cdd2b:
  de_cleanup(&de);
  return CURLE_COULDNT_RESOLVE_HOST;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct connectdata *conn,
                              struct Curl_dns_entry **dnsp)
{
  struct Curl_easy *data = conn->data;
  *dnsp = NULL; /* defaults to no response */

  if(!data->req.doh.probe[0].easy && !data->req.doh.probe[1].easy) {
    failf(data, "Could not DOH-resolve: %s", conn->async.hostname);
    return conn->bits.proxy?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!data->req.doh.pending) {
    DOHcode rc;
    DOHcode rc2;
    struct dohentry de;
    /* remove DOH handles from multi handle and close them */
    curl_multi_remove_handle(data->multi, data->req.doh.probe[0].easy);
    Curl_close(data->req.doh.probe[0].easy);
    curl_multi_remove_handle(data->multi, data->req.doh.probe[1].easy);
    Curl_close(data->req.doh.probe[1].easy);

    /* parse the responses, create the struct and return it! */
    init_dohentry(&de);
    rc = doh_decode(data->req.doh.probe[0].serverdoh.memory,
                    data->req.doh.probe[0].serverdoh.size,
                    data->req.doh.probe[0].dnstype,
                    &de);
    free(data->req.doh.probe[0].serverdoh.memory);
    if(rc) {
      infof(data, "DOH: %s type %s for %s\n", doh_strerror(rc),
            type2name(data->req.doh.probe[0].dnstype),
            data->req.doh.host);
    }
    rc2 = doh_decode(data->req.doh.probe[1].serverdoh.memory,
                     data->req.doh.probe[1].serverdoh.size,
                     data->req.doh.probe[1].dnstype,
                     &de);
    free(data->req.doh.probe[1].serverdoh.memory);
    if(rc2) {
      infof(data, "DOH: %s type %s for %s\n", doh_strerror(rc2),
            type2name(data->req.doh.probe[1].dnstype),
            data->req.doh.host);
    }
    if(!rc || !rc2) {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DOH Host name: %s\n", data->req.doh.host);
      showdoh(data, &de);

      ai = doh2ai(&de, data->req.doh.host, data->req.doh.port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, data->req.doh.host, data->req.doh.port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      de_cleanup(&de);
      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      else {
        conn->async.dns = dns;
        *dnsp = dns;
        return CURLE_OK;
      }
    }
    de_cleanup(&de);

    return CURLE_COULDNT_RESOLVE_HOST;
  }

  return CURLE_OK;
}